

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  bool bVar1;
  char *pcVar2;
  pointer ppcVar3;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  string currentStart;
  string filesDir;
  cmMakefileCurrent cmf;
  
  cmMakefileCurrent::cmMakefileCurrent(&cmf,this);
  pcVar2 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  std::__cxx11::string::string((string *)&filesDir,pcVar2,(allocator *)&currentStart);
  std::__cxx11::string::append((char *)&filesDir);
  cmsys::SystemTools::MakeDirectory(filesDir._M_dataplus._M_p);
  pcVar2 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  std::__cxx11::string::string((string *)&currentStart,pcVar2,(allocator *)&subdirs);
  std::__cxx11::string::append((char *)&currentStart);
  bVar1 = cmsys::SystemTools::FileExists(currentStart._M_dataplus._M_p,true);
  if (bVar1) {
    ProcessBuildsystemFile(this,currentStart._M_dataplus._M_p);
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              (&subdirs,&this->UnConfiguredDirectories);
    for (ppcVar3 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppcVar3 !=
        subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
      ConfigureSubDirectory(this,*ppcVar3);
    }
    AddCMakeDependFilesFromUser(this);
    this->Configured = true;
    std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
              (&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
    std::__cxx11::string::~string((string *)&currentStart);
    std::__cxx11::string::~string((string *)&filesDir);
    cmMakefileCurrent::~cmMakefileCurrent(&cmf);
    return;
  }
  __assert_fail("cmSystemTools::FileExists(currentStart.c_str(), true)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmMakefile.cxx"
                ,0x685,"void cmMakefile::Configure()");
}

Assistant:

void cmMakefile::Configure()
{
  cmMakefileCurrent cmf(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetCurrentBinaryDirectory();
  filesDir += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(filesDir.c_str());

  std::string currentStart = this->StateSnapshot.GetCurrentSourceDirectory();
  currentStart += "/CMakeLists.txt";
  assert(cmSystemTools::FileExists(currentStart.c_str(), true));
  this->ProcessBuildsystemFile(currentStart.c_str());

   // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi)
    {
    this->ConfigureSubDirectory(*sdi);
    }

  this->AddCMakeDependFilesFromUser();
  this->SetConfigured();
}